

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

size_t xmlDictGetUsage(xmlDictPtr dict)

{
  size_t sVar1;
  xmlDictStringsPtr_conflict pxVar2;
  
  if ((dict != (xmlDictPtr)0x0) &&
     (pxVar2 = dict->strings, pxVar2 != (xmlDictStringsPtr_conflict)0x0)) {
    sVar1 = 0;
    do {
      sVar1 = sVar1 + pxVar2->size;
      pxVar2 = pxVar2->next;
    } while (pxVar2 != (xmlDictStringsPtr)0x0);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t
xmlDictGetUsage(xmlDictPtr dict) {
    xmlDictStringsPtr pool;
    size_t limit = 0;

    if (dict == NULL)
	return(0);
    pool = dict->strings;
    while (pool != NULL) {
        limit += pool->size;
	pool = pool->next;
    }
    return(limit);
}